

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_member_reference_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t base,SPIRType *type,
          uint32_t index,bool ptr_chain_is_resolved)

{
  bool bVar1;
  SPIRVariable *pSVar2;
  SPIRType *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string local_50;
  
  pSVar2 = Compiler::maybe_get_backing_variable((Compiler *)this,base);
  if (pSVar2 == (SPIRVariable *)0x0) {
LAB_002c0bad:
    if (!ptr_chain_is_resolved) {
      bVar1 = CompilerGLSL::should_dereference(&this->super_CompilerGLSL,base);
      if (bVar1) goto LAB_002c0bc1;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)index;
    CompilerGLSL::to_member_name_abi_cxx11_(&local_50,&this->super_CompilerGLSL,type,index);
    join<char_const(&)[2],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)0x3be36f,(char (*) [2])&local_50,pbVar3);
  }
  else {
    bVar1 = Compiler::has_decoration((Compiler *)this,(ID)(type->super_IVariant).self.id,Block);
    if (!bVar1) {
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(type->super_IVariant).self.id,BufferBlock);
      if (!bVar1) goto LAB_002c0bad;
    }
    if ((pSVar2->storage != StorageBuffer) && (pSVar2->storage != StorageClassUniform))
    goto LAB_002c0bad;
    type_00 = Compiler::get_pointee_type
                        ((Compiler *)this,*(uint32_t *)&(pSVar2->super_IVariant).field_0xc);
    bVar1 = Compiler::is_array((Compiler *)this,type_00);
    if (!bVar1) goto LAB_002c0bad;
LAB_002c0bc1:
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)index;
    CompilerGLSL::to_member_name_abi_cxx11_(&local_50,&this->super_CompilerGLSL,type,index);
    join<char_const(&)[3],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)0x40a804,(char (*) [3])&local_50,pbVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_member_reference(uint32_t base, const SPIRType &type, uint32_t index, bool ptr_chain_is_resolved)
{
	auto *var = maybe_get_backing_variable(base);
	// If this is a buffer array, we have to dereference the buffer pointers.
	// Otherwise, if this is a pointer expression, dereference it.

	bool declared_as_pointer = false;

	if (var)
	{
		// Only allow -> dereference for block types. This is so we get expressions like
		// buffer[i]->first_member.second_member, rather than buffer[i]->first->second.
		const bool is_block =
		    has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);

		bool is_buffer_variable =
		    is_block && (var->storage == StorageClassUniform || var->storage == StorageClassStorageBuffer);
		declared_as_pointer = is_buffer_variable && is_array(get_pointee_type(var->basetype));
	}

	if (declared_as_pointer || (!ptr_chain_is_resolved && should_dereference(base)))
		return join("->", to_member_name(type, index));
	else
		return join(".", to_member_name(type, index));
}